

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
IDisk::GetCAT_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,IDisk *this,AutorunType *autorun_type,int user)

{
  char *__s;
  uint uVar1;
  MFMTrack *pMVar2;
  ILog *pIVar3;
  bool bVar4;
  uint uVar5;
  void *__s_00;
  size_t sVar6;
  AutorunType AVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  pointer paVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint track;
  ulong uVar17;
  byte bVar18;
  Track track_info;
  string str;
  Track local_a8;
  value_type local_88;
  long local_68;
  ulong local_60;
  IDisk *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *autorun_type = AUTO_UNKNOWN;
  local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GetTrackInfo(this,0,0,&local_a8);
  if (local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_start) goto LAB_0014df9c;
  track = 0;
  paVar12 = local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar12->r == 'A') {
      track = 2;
    }
    paVar12 = paVar12 + 1;
  } while (paVar12 !=
           local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
           _M_impl.super__Vector_impl_data._M_finish);
  bVar18 = (local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start)->r;
  AVar7 = AUTO_FILE;
  lVar15 = 0x41;
  uVar8 = track;
  if ((bVar18 & 0xc0) == 0x40) {
LAB_0014dcf5:
    track = uVar8;
    lVar10 = lVar15;
    *autorun_type = AVar7;
  }
  else {
    if (0xbf < bVar18) {
      lVar15 = 0xc1;
      uVar8 = 0;
      goto LAB_0014dcf5;
    }
    lVar10 = 0;
    AVar7 = AUTO_CPM;
    lVar15 = 1;
    uVar8 = 1;
    if (bVar18 < 0x40) goto LAB_0014dcf5;
  }
  if (track != 0) {
    if (local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    GetTrackInfo(this,0,track,&local_a8);
  }
  __s_00 = operator_new__(0x800);
  uVar8 = 0;
  memset(__s_00,0,0x800);
  if ((long)local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    local_60 = ((long)local_a8.list_sector_.
                      super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a8.list_sector_.
                      super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
    pMVar2 = this->side_[0].tracks;
    uVar13 = 0;
    iVar14 = 0;
    uVar17 = 0;
    do {
      if (((uint)lVar10 <=
           (uint)local_a8.list_sector_.
                 super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].r) &&
         (lVar15 = (ulong)local_a8.list_sector_.
                          super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13].r - lVar10, (int)lVar15 < 4)) {
        uVar16 = lVar15 * 0x200;
        iVar14 = iVar14 + 1;
        if (local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar13].real_size == 0) {
          uVar17 = uVar16 & 0xffffffff;
        }
        else {
          iVar9 = local_a8.list_sector_.
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13].dam_offset + 0x40;
          uVar8 = 0;
          do {
            uVar5 = iVar9 + 1;
            uVar1 = pMVar2[track].size;
            uVar11 = 0xfffffffe;
            bVar18 = 0;
            do {
              if (uVar1 <= uVar5) {
                uVar5 = uVar5 % uVar1;
              }
              bVar18 = pMVar2[track].bitfield[uVar5] & 1 | bVar18 * '\x02';
              uVar5 = uVar5 + 2;
              uVar11 = uVar11 + 2;
            } while (uVar11 < 0xe);
            uVar17 = uVar16 + 1;
            *(byte *)((long)__s_00 + uVar16) = bVar18;
            uVar8 = uVar8 + 1;
          } while ((uVar8 < local_a8.list_sector_.
                            super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar13].real_size) &&
                  (iVar9 = iVar9 + 0x10, bVar4 = (long)uVar16 < 0x7ff, uVar16 = uVar17, bVar4));
        }
      }
      uVar8 = (uint)uVar17;
      uVar13 = (ulong)((int)uVar13 + 1);
      local_68 = lVar10;
      local_58 = this;
    } while ((uVar13 < local_60) && ((iVar14 < 4 && ((int)uVar8 < 0x800))));
  }
  if (0 < (int)uVar8) {
    uVar17 = 0;
    iVar14 = 0;
    do {
      pIVar3 = this->log_;
      if (pIVar3 != (ILog *)0x0) {
        (**(code **)(*(long *)pIVar3 + 8))(pIVar3,*(undefined1 *)((long)__s_00 + uVar17));
      }
      pIVar3 = this->log_;
      if (pIVar3 != (ILog *)0x0) {
        (*(code *)**(undefined8 **)pIVar3)(pIVar3," ");
      }
      iVar14 = iVar14 + 1;
      if (iVar14 == 0x10) {
        iVar14 = 0;
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 0x20))();
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar8 != uVar17);
  }
  uVar17 = 1;
  do {
    if ((user == -1) || ((uint)*(byte *)((long)__s_00 + (uVar17 - 1)) == user)) {
      __s = (char *)((long)__s_00 + uVar17);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar6);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      bVar4 = ValidName(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    bVar4 = uVar17 < 0x7e0;
    uVar17 = uVar17 + 0x20;
  } while (bVar4);
  operator_delete__(__s_00);
LAB_0014df9c:
  if (local_a8.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.list_sector_.
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.list_sector_.
                          super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.list_sector_.
                          super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>  IDisk::GetCAT(IDisk::AutorunType& autorun_type, int user)
{
   std::vector<std::string> filename_vector;
   autorun_type = IDisk::AUTO_UNKNOWN;

   // Get info
   IDisk::Track track_info;
   GetTrackInfo(0, 0, &track_info);

   if (track_info.list_sector_.size() == 0)
   {
      return filename_vector;
   }

   // CPM ?
   int index_cat = 0;
   unsigned char first_sector = 00;
   // A |CPM can be run if a"0x41" sector is found
   for (auto it = track_info.list_sector_.begin(); it != track_info.list_sector_.end(); ++it)
   {
      if (it->r == 0x41)
      {
         index_cat = 2;
      }
   }

   // SYSTEM / VENDOR
   if ((track_info.list_sector_.at(0).r & 0xC0) == 0x40)
   {
      first_sector = 0x41;
      autorun_type = IDisk::AUTO_FILE;
   }
   // DATA
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0xC0)
   {
      index_cat = 0;
      first_sector = 0xC1;
      autorun_type = IDisk::AUTO_FILE;
   }
   // IBM
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0x00
      || (track_info.list_sector_.at(0).r & 0xC0) == 0x80)
   {
      index_cat = 1;
      first_sector = 0x01;
      autorun_type = IDisk::AUTO_CPM;
   }

   if (index_cat != 0)
   {
      track_info.list_sector_.clear();
      GetTrackInfo(0, index_cat, &track_info);
   }

#define NB_SECTOR_FOR_CAT 4

   int total_size = NB_SECTOR_FOR_CAT * 512;
   /*for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   {
      totalSize += trackInfo.listSector.at(i).RealSize;
   }*/

   // No, try to fins appropriate file to run
   unsigned char* track_data = new unsigned char[total_size];
   memset(track_data, 0, total_size);
   int offset_data = 0;


   // It's in first track, NB_SECTOR_FOR_CAT firsts sectors, from first_sector to first_sector + NB_SECTOR_FOR_CAT
   // todo : read the proper sectors !
   int nb_sector_read = 0;

   //for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   unsigned int index_sector = 0;
   int nb_read_sector = 0;
   while (index_sector < track_info.list_sector_.size() && nb_read_sector < NB_SECTOR_FOR_CAT && offset_data < total_size)
   {
      // Read first xx sectors
      if (track_info.list_sector_.at(index_sector).r >= first_sector)
      {
         if (track_info.list_sector_.at(index_sector).r - first_sector < NB_SECTOR_FOR_CAT)
         {
            int index = track_info.list_sector_.at(index_sector).dam_offset + 64;

            offset_data = (track_info.list_sector_.at(index_sector).r - first_sector) * 512;
            nb_read_sector++;
            for (int cpt = 0; cpt < track_info.list_sector_.at(index_sector).real_size && offset_data < total_size; cpt++)
            {
               // Walk all of them - remove the 0x80 bits
               unsigned char b = GetNextByte(0, index_cat, index);
               track_data[offset_data++] = b;
               index += 16;
            }
         }
      }
      index_sector++;
   }

   // Dump TrackData
   int line_count = 0;
   for (int hex = 0; hex < offset_data; hex++)
   {
      LOGB(track_data[hex]);
      LOG(" ");
      if (++line_count == 16)
      {
         LOGEOL
            line_count = 0;
      }
   }

   int offset = 1;
   bool end = false;

   while (offset < total_size && !end)
   {
      if (user == -1 || track_data[offset - 1] == user)
      {
         // Add to the name vector
         std::string str = (const char*)(&track_data[offset]);
         if (ValidName(str))
         {
            filename_vector.push_back(str);
         }
      }
      offset += 32;
   }
   delete[]track_data;

   return filename_vector;
}